

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf,string *target)

{
  char *pcVar1;
  allocator local_71;
  string local_70 [8];
  string message;
  undefined1 local_40 [8];
  string depname;
  string *target_local;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  depname.field_2._8_8_ = target;
  std::__cxx11::string::string((string *)local_40,(string *)target);
  std::__cxx11::string::operator+=((string *)local_40,"_LIB_DEPENDS");
  if ((this->RecordDependencies & 1U) == 0) {
    pcVar1 = cmMakefile::GetDefinition(mf,(string *)local_40);
    if (pcVar1 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Target ",&local_71);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::__cxx11::string::operator+=(local_70,(string *)depname.field_2._8_8_);
      std::__cxx11::string::operator+=(local_70," has dependency information when it shouldn\'t.\n")
      ;
      std::__cxx11::string::operator+=
                (local_70,"Your cache is probably stale. Please remove the entry\n  ");
      std::__cxx11::string::operator+=(local_70,(string *)local_40);
      std::__cxx11::string::operator+=(local_70,"\nfrom the cache.");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_70);
    }
  }
  else {
    cmMakefile::AddCacheDefinition(mf,(string *)local_40,"","Dependencies for target",STATIC,false);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf,
                                          const std::string& target)
{
  // Clear the dependencies. The cache variable must exist iff we are
  // recording dependency information for this target.
  std::string depname = target;
  depname += "_LIB_DEPENDS";
  if (this->RecordDependencies) {
    mf.AddCacheDefinition(depname, "", "Dependencies for target",
                          cmStateEnums::STATIC);
  } else {
    if (mf.GetDefinition(depname)) {
      std::string message = "Target ";
      message += target;
      message += " has dependency information when it shouldn't.\n";
      message += "Your cache is probably stale. Please remove the entry\n  ";
      message += depname;
      message += "\nfrom the cache.";
      cmSystemTools::Error(message.c_str());
    }
  }
}